

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

void __thiscall QAnimationTimer::QAnimationTimer(QAnimationTimer *this)

{
  QAbstractAnimationTimer *in_RDI;
  
  QAbstractAnimationTimer::QAbstractAnimationTimer(in_RDI);
  (in_RDI->super_QObject)._vptr_QObject = (_func_int **)&PTR_metaObject_00be90d8;
  in_RDI[1].super_QObject._vptr_QObject = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[1].super_QObject.d_ptr.d = 0;
  *(undefined1 *)((long)&in_RDI[1].super_QObject.d_ptr.d + 4) = 0;
  *(undefined1 *)((long)&in_RDI[1].super_QObject.d_ptr.d + 5) = 0;
  *(undefined1 *)((long)&in_RDI[1].super_QObject.d_ptr.d + 6) = 0;
  QList<QAbstractAnimation_*>::QList((QList<QAbstractAnimation_*> *)0x6696c3);
  QList<QAbstractAnimation_*>::QList((QList<QAbstractAnimation_*> *)0x6696d1);
  in_RDI[3].isRegistered = false;
  in_RDI[3].isPaused = false;
  *(undefined2 *)&in_RDI[3].field_0x12 = 0;
  QList<QAbstractAnimation_*>::QList((QList<QAbstractAnimation_*> *)0x6696e6);
  return;
}

Assistant:

QAnimationTimer::QAnimationTimer() :
    QAbstractAnimationTimer(), lastTick(0),
    currentAnimationIdx(0), insideTick(false),
    startAnimationPending(false), stopTimerPending(false),
    runningLeafAnimations(0)
{
}